

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
AdapterPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_kj::_::PromiseAndFulfillerAdapter<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>
::destroy(AdapterPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_kj::_::PromiseAndFulfillerAdapter<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>
          *this)

{
  WeakFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  *this_00;
  
  this_00 = (this->adapter).wrapper;
  if ((this_00->super_WeakFulfillerBase).inner == (PromiseRejector *)0x0) {
    AsyncObject::~AsyncObject((AsyncObject *)this_00);
    operator_delete(this_00,0x18);
  }
  else {
    (this_00->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  }
  if ((this->result).value.ptr.isSet == true) {
    anon_unknown_36::ConcurrencyLimitingHttpClient::ConnectionCounter::~ConnectionCounter
              (&(this->result).value.ptr.field_1.value);
  }
  if ((this->result).super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&(this->result).super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  AsyncObject::~AsyncObject
            ((AsyncObject *)
             &this->
              super_PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
            );
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }